

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O3

void __thiscall llbuild::buildsystem::BuildValue::BuildValue(BuildValue *this,BinaryDecoder *coder)

{
  uint8_t *puVar1;
  char *pcVar2;
  byte bVar3;
  Kind KVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  FileInfo *pFVar7;
  ulong uVar8;
  uint n;
  StringList local_38;
  
  (this->stringValues).contents = (char *)0x0;
  (this->stringValues).size = 0;
  *(undefined8 *)((long)&this->valueData + 0x40) = 0;
  *(undefined8 *)((long)&this->valueData + 0x48) = 0;
  *(undefined8 *)((long)&this->valueData + 0x30) = 0;
  *(undefined8 *)((long)&this->valueData + 0x38) = 0;
  (this->valueData).asOutputInfo.modTime.seconds = 0;
  (this->valueData).asOutputInfo.modTime.nanoseconds = 0;
  (this->valueData).asOutputInfo.mode = 0;
  (this->valueData).asOutputInfo.size = 0;
  (this->valueData).asOutputInfo.device = 0;
  (this->valueData).asOutputInfo.inode = 0;
  this->kind = Invalid;
  this->numOutputInfos = 0;
  (this->signature).value = 0;
  if (coder->pos != (coder->data).Length) {
    bVar3 = basic::BinaryDecoder::read8(coder);
    KVar4 = (Kind)bVar3;
    this->kind = (uint)bVar3;
    if ((bVar3 < 0x12) && ((0x20060U >> (bVar3 & (FilteredDirectoryContents|Target)) & 1) != 0)) {
      uVar5 = basic::BinaryDecoder::read32(coder);
      uVar6 = basic::BinaryDecoder::read32(coder);
      (this->signature).value = CONCAT44(uVar6,uVar5);
      KVar4 = this->kind;
    }
    if ((KVar4 < (FilteredDirectoryContents|ExistingInput)) &&
       ((0x20414U >> (KVar4 & (FilteredDirectoryContents|Target)) & 1) != 0)) {
      uVar5 = basic::BinaryDecoder::read32(coder);
      this->numOutputInfos = uVar5;
      if (1 < uVar5) {
        pFVar7 = (FileInfo *)operator_new__((ulong)uVar5 * 0x50);
        uVar8 = 0;
        do {
          puVar1 = (pFVar7->checksum).bytes + uVar8 + 0x10;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          puVar1[8] = '\0';
          puVar1[9] = '\0';
          puVar1[10] = '\0';
          puVar1[0xb] = '\0';
          puVar1[0xc] = '\0';
          puVar1[0xd] = '\0';
          puVar1[0xe] = '\0';
          puVar1[0xf] = '\0';
          puVar1 = (pFVar7->checksum).bytes + uVar8;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          puVar1[8] = '\0';
          puVar1[9] = '\0';
          puVar1[10] = '\0';
          puVar1[0xb] = '\0';
          puVar1[0xc] = '\0';
          puVar1[0xd] = '\0';
          puVar1[0xe] = '\0';
          puVar1[0xf] = '\0';
          uVar8 = uVar8 + 0x50;
        } while ((ulong)uVar5 * 0x50 != uVar8);
        (this->valueData).asOutputInfos = pFVar7;
      }
      if (uVar5 != 0) {
        n = 0;
        do {
          pFVar7 = getNthOutputInfo(this,n);
          basic::BinaryCodingTraits<llbuild::basic::FileInfo>::decode(pFVar7,coder);
          n = n + 1;
        } while (n != this->numOutputInfos);
      }
    }
    if ((this->kind < SuccessfulCommandWithOutputSignature) &&
       ((0x10090U >> (this->kind & (FilteredDirectoryContents|Target)) & 1) != 0)) {
      basic::StringList::StringList(&local_38,coder);
      if (&this->stringValues == &local_38) {
        if (local_38.contents != (char *)0x0) {
          operator_delete__(local_38.contents);
        }
      }
      else {
        (this->stringValues).size = local_38.size;
        pcVar2 = (this->stringValues).contents;
        if (pcVar2 != (char *)0x0) {
          operator_delete__(pcVar2);
        }
        (this->stringValues).contents = local_38.contents;
      }
    }
    if (coder->pos != (coder->data).Length) {
      __assert_fail("isEmpty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/Basic/BinaryCoding.h"
                    ,0xd4,"void llbuild::basic::BinaryDecoder::finish()");
    }
  }
  return;
}

Assistant:

inline buildsystem::BuildValue::BuildValue(basic::BinaryDecoder& coder) {
  // Handle empty decode requests.
  if (coder.isEmpty()) {
    kind = BuildValue::Kind::Invalid;
    return;
  }
  
  coder.read(kind);
  if (kindHasSignature())
    coder.read(signature);
  if (kindHasOutputInfo()) {
    coder.read(numOutputInfos);
    if (numOutputInfos > 1) {
      valueData.asOutputInfos = new FileInfo[numOutputInfos];
    }
    for (uint32_t i = 0; i != numOutputInfos; ++i) {
      coder.read(getNthOutputInfo(i));
    }
  }
  if (kindHasStringList()) {
    stringValues = basic::StringList(coder);
  }
  coder.finish();
}